

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O0

void get_cmp(char **pt,char *kvalue,kwdtyp *ktype,unsigned_long *stat)

{
  ushort **ppuVar1;
  bool bVar2;
  char local_138;
  undefined1 local_137 [7];
  char card [81];
  char local_d8 [8];
  char temp [81];
  kwdtyp local_7c;
  kwdtyp itype;
  kwdtyp rtype;
  unsigned_long ti;
  unsigned_long tr;
  int local_60;
  int set_paren;
  int set_comm;
  int nchar;
  char *pi_end;
  char *pi_beg;
  char *pr_end;
  char *pr_beg;
  char **pp;
  char *p;
  unsigned_long *stat_local;
  kwdtyp *ktype_local;
  char *kvalue_local;
  char **pt_local;
  
  pi_beg = (char *)0x0;
  _set_comm = (char **)0x0;
  local_60 = 0;
  tr._4_4_ = 0;
  ti = 0;
  _itype = 0;
  p = (char *)stat;
  stat_local = (unsigned_long *)ktype;
  ktype_local = (kwdtyp *)kvalue;
  kvalue_local = (char *)pt;
  strcpy(&local_138,*pt);
  card[0x48] = '\0';
  *(undefined4 *)stat_local = 4;
  pr_end = local_137;
  local_d8[0] = '\0';
  pp = (char **)pr_end;
  while( true ) {
    bVar2 = false;
    if (*(char *)pp != '\0') {
      bVar2 = *(char *)pp != '/';
    }
    if (!bVar2) goto LAB_001137e6;
    if (*(char *)pp == ')') break;
    if ((local_60 == 0) && (*(char *)pp == ',')) {
      local_60 = 1;
      pi_beg = (char *)pp;
      pi_end = (char *)((long)pp + 1);
    }
    else if (*(char *)pp == ',') {
      *(ulong *)p = *(ulong *)p | 0x40;
    }
    pp = (char **)((long)pp + 1);
  }
  tr._4_4_ = 1;
  _set_comm = pp;
  pp = (char **)((long)pp + 1);
LAB_001137e6:
  if (local_60 == 0) {
    *(ulong *)p = *(ulong *)p | 0x20;
  }
  if (tr._4_4_ == 0) {
    *(ulong *)p = *(ulong *)p | 0x10;
    _set_comm = pp;
    do {
      _set_comm = (char **)((long)_set_comm + -1);
      ppuVar1 = __ctype_b_loc();
    } while (((*ppuVar1)[(int)*(char *)_set_comm] & 0x2000) != 0);
    _set_comm = (char **)((long)_set_comm + 1);
  }
  set_paren = (int)_set_comm - (int)&local_138;
  strncpy((char *)ktype_local,&local_138,(long)set_paren);
  *(undefined1 *)((long)ktype_local + (long)set_paren) = 0;
  while( true ) {
    ppuVar1 = __ctype_b_loc();
    bVar2 = false;
    if (((*ppuVar1)[(int)*(char *)pp] & 0x2000) != 0) {
      bVar2 = *(char *)pp != '\0';
    }
    if (!bVar2) break;
    pp = (char **)((long)pp + 1);
  }
  *(long *)kvalue_local = (long)pp + (*(long *)kvalue_local - (long)&local_138);
  *pi_beg = '\0';
  *(char *)_set_comm = '\0';
  while( true ) {
    ppuVar1 = __ctype_b_loc();
    bVar2 = false;
    if (((*ppuVar1)[(int)*pr_end] & 0x2000) != 0) {
      bVar2 = *pr_end != '\0';
    }
    if (!bVar2) break;
    pr_end = pr_end + 1;
  }
  while( true ) {
    ppuVar1 = __ctype_b_loc();
    bVar2 = false;
    if (((*ppuVar1)[(int)*pi_end] & 0x2000) != 0) {
      bVar2 = *pi_end != '\0';
    }
    if (!bVar2) break;
    pi_end = pi_end + 1;
  }
  local_d8[0] = '\0';
  pr_beg = (char *)&pr_end;
  get_num((char **)pr_beg,local_d8,&local_7c,&ti);
  if (ti != 0) {
    *(ulong *)p = *(ulong *)p | 0x80;
  }
  local_d8[0] = '\0';
  pr_beg = (char *)&pi_end;
  get_num((char **)pr_beg,local_d8,(kwdtyp *)(temp + 0x50),(unsigned_long *)&itype);
  if (_itype != 0) {
    *(ulong *)p = *(ulong *)p | 0x100;
  }
  if ((local_7c == FLT_KEY) || (stack0xffffffffffffff80 == 3)) {
    *(undefined4 *)stat_local = 5;
  }
  return;
}

Assistant:

void get_cmp(char **pt,     		/* card string */
	    char *kvalue,		/* comment string */
	    kwdtyp *ktype, 
	    unsigned long *stat		/* error number */
	   )
{
    char *p;
    char **pp;
    char *pr_beg;			/* end of real part */
    char *pr_end=0;			/* end of real part */
    char *pi_beg;			/* beginning of the imaginay part */
    char *pi_end=0;			/* end of real part */
    int  nchar;
    int set_comm = 0;
    int set_paren = 0;

    unsigned long tr  = 0;
    unsigned long ti = 0;
    kwdtyp rtype, itype;
    char temp[FLEN_CARD];
    char card[FLEN_CARD];

  
    strcpy(card,*pt);			/* save the original */
    card[FLEN_CARD-1] = '\0'; 

    *ktype = CMI_KEY;			/* default: integer complex */
    p = card + 1;
    pr_beg = p;

    temp[0] = '\0';
    while(*p != '\0' && *p != '/') { 
	if(*p == ')') { 
	    set_paren = 1; 
	    pi_end = p;
	    p++;
	    break;
        }
	if(!set_comm && *p == ',') { 
	    set_comm = 1;
	    pr_end = p;
	    pi_beg = p+1;
        }
        else if(*p == ',') {	
	    *stat |= TOO_MANY_COMMA;
        }
	p++;
    } 
    if(!set_comm) *stat |= NO_COMMA; 
    if(!set_paren) { 
	*stat |= NO_TRAIL_PAREN; 
	pi_end = p;
	pi_end--;
	while(isspace((int)*pi_end))pi_end--;
	pi_end++;
    }
	    
    nchar = pi_end - card ; 
    strncpy(kvalue,card,nchar);
    *(kvalue+nchar) = '\0'; 
    while(isspace((int)*p)&& *p != '\0')  p++; 
    *pt = *pt + (p - card); 

    /* analyse the real and imagine part */ 
    *pr_end = '\0';
    *pi_end = '\0'; 
    while(isspace((int)*pr_beg) && *pr_beg != '\0')  pr_beg++; 
    while(isspace((int)*pi_beg) && *pi_beg != '\0')  pi_beg++; 
    temp[0] = '\0';
    pp = &pr_beg;
    get_num(pp, temp, &rtype, &tr); 
    if(tr)*stat |= BAD_REAL; 
    temp[0] = '\0';
    pp = &pi_beg;
    get_num(pp, temp, &itype, &ti); 
    if(ti)*stat |= BAD_IMG; 
    if(rtype == FLT_KEY || itype == FLT_KEY) *ktype = CMF_KEY;
    return;
}